

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O1

Compaction * __thiscall
leveldb::VersionSet::CompactRange(VersionSet *this,int level,InternalKey *begin,InternalKey *end)

{
  int *piVar1;
  long lVar2;
  Options *pOVar3;
  Version *pVVar4;
  Compaction *c;
  ulong uVar5;
  long lVar6;
  size_type __new_size;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> inputs;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> local_38;
  
  local_38.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Version::GetOverlappingInputs(this->current_,level,begin,end,&local_38);
  if (local_38.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_38.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    c = (Compaction *)0x0;
  }
  else {
    if ((0 < level) &&
       ((long)local_38.
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_38.
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_start != 0)) {
      lVar6 = (long)local_38.
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_38.
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
      uVar5 = 0;
      __new_size = 1;
      do {
        uVar5 = uVar5 + local_38.
                        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[__new_size - 1]->file_size;
        if (this->options_->max_file_size <= uVar5) {
          std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::resize
                    (&local_38,__new_size);
          break;
        }
        lVar2 = (-(ulong)(lVar6 == 0) - lVar6) + __new_size;
        __new_size = __new_size + 1;
      } while (lVar2 != 0);
    }
    c = (Compaction *)operator_new(0x158);
    pOVar3 = this->options_;
    c->level_ = level;
    c->max_output_file_size_ = pOVar3->max_file_size;
    c->input_version_ = (Version *)0x0;
    VersionEdit::VersionEdit(&c->edit_);
    c->level_ptrs_[5] = 0;
    c->level_ptrs_[6] = 0;
    c->level_ptrs_[3] = 0;
    c->level_ptrs_[4] = 0;
    c->level_ptrs_[1] = 0;
    c->level_ptrs_[2] = 0;
    c->overlapped_bytes_ = 0;
    c->level_ptrs_[0] = 0;
    c->inputs_[0].
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    c->inputs_[0].
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    c->inputs_[0].
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    c->inputs_[1].
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    c->inputs_[1].
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    c->inputs_[1].
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (c->grandparents_).
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (c->grandparents_).
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (c->grandparents_).
    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    c->grandparent_index_ = 0;
    c->seen_key_ = false;
    pVVar4 = this->current_;
    c->input_version_ = pVVar4;
    piVar1 = &pVVar4->refs_;
    *piVar1 = *piVar1 + 1;
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator=
              (c->inputs_,&local_38);
    SetupOtherInputs(this,c);
  }
  if (local_38.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return c;
}

Assistant:

Compaction* VersionSet::CompactRange(int level, const InternalKey* begin,
                                     const InternalKey* end) {
  std::vector<FileMetaData*> inputs;
  current_->GetOverlappingInputs(level, begin, end, &inputs);
  if (inputs.empty()) {
    return nullptr;
  }

  // Avoid compacting too much in one shot in case the range is large.
  // But we cannot do this for level-0 since level-0 files can overlap
  // and we must not pick one file and drop another older file if the
  // two files overlap.
  if (level > 0) {
    const uint64_t limit = MaxFileSizeForLevel(options_, level);
    uint64_t total = 0;
    for (size_t i = 0; i < inputs.size(); i++) {
      uint64_t s = inputs[i]->file_size;
      total += s;
      if (total >= limit) {
        inputs.resize(i + 1);
        break;
      }
    }
  }

  Compaction* c = new Compaction(options_, level);
  c->input_version_ = current_;
  c->input_version_->Ref();
  c->inputs_[0] = inputs;
  SetupOtherInputs(c);
  return c;
}